

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

Bitset * __thiscall spirv_cross::ParsedIR::get_decoration_bitset(ParsedIR *this,ID id)

{
  Meta *pMVar1;
  Decoration *dec;
  Meta *m;
  ParsedIR *this_local;
  Bitset *pBStack_10;
  ID id_local;
  
  pMVar1 = find_meta(this,id);
  if (pMVar1 == (Meta *)0x0) {
    pBStack_10 = &this->cleared_bitset;
  }
  else {
    pBStack_10 = &(pMVar1->decoration).decoration_flags;
  }
  return pBStack_10;
}

Assistant:

const Bitset &ParsedIR::get_decoration_bitset(ID id) const
{
	auto *m = find_meta(id);
	if (m)
	{
		auto &dec = m->decoration;
		return dec.decoration_flags;
	}
	else
		return cleared_bitset;
}